

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O0

string * __thiscall
LinearSystem::ToString_abi_cxx11_(string *__return_storage_ptr__,LinearSystem *this)

{
  bool bVar1;
  int iVar2;
  reference operation_00;
  Matrix *this_00;
  ostream *this_01;
  int m;
  Operation *operation;
  const_iterator __end1;
  const_iterator __begin1;
  vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_> *__range1;
  SwapMatrix swaps;
  undefined1 local_2c8 [8];
  LinearSystem current_system;
  ostringstream out;
  LinearSystem *this_local;
  
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)
             &current_system.history_.
              super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  LinearSystem((LinearSystem *)local_2c8,&this->start_system_,this->mode_);
  operator<<((ostream *)
             &current_system.history_.
              super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (ExtendedMatrix *)
             ((long)&current_system.start_system_.extension_column_permutation_.permutation_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data +
             0x10));
  SwapMatrix::SwapMatrix((SwapMatrix *)((long)&__range1 + 4));
  __end1 = std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::begin
                     (&this->history_);
  operation = (Operation *)
              std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>::end
                        (&this->history_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_LinearSystem::Operation_*,_std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>_>
                                     *)&operation), bVar1) {
    operation_00 = __gnu_cxx::
                   __normal_iterator<const_LinearSystem::Operation_*,_std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>_>
                   ::operator*(&__end1);
    ApplyOperation((LinearSystem *)local_2c8,operation_00);
    if (operation_00->operation_type == SwapRows) {
      SwapMatrix::SetRowSwap
                ((SwapMatrix *)((long)&__range1 + 4),operation_00->lhs,operation_00->rhs);
      if (this->mode_ == LU) {
        this_00 = ExtendedMatrix::GetMainMatrix(&this->system_);
        iVar2 = Matrix::GetNumColumns(this_00);
        SwapMatrix::SetExtensionColumnSwap
                  ((SwapMatrix *)((long)&__range1 + 4),operation_00->lhs + iVar2,
                   operation_00->rhs + iVar2);
      }
    }
    else if (operation_00->operation_type == SwapColumns) {
      SwapMatrix::SetMainColumnSwap
                ((SwapMatrix *)((long)&__range1 + 4),operation_00->lhs,operation_00->rhs);
    }
    if ((Options::step_by_step_type == 2) ||
       ((Options::step_by_step_type == 1 && (operation_00->operation_type == MainOutput)))) {
      std::ostream::operator<<
                (&current_system.history_.
                  super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 std::endl<char,std::char_traits<char>>);
      bVar1 = SwapMatrix::IsEmpty((SwapMatrix *)((long)&__range1 + 4));
      if (!bVar1) {
        this_01 = operator<<((ostream *)
                             &current_system.history_.
                              super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (SwapMatrix *)((long)&__range1 + 4));
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        SwapMatrix::Clear((SwapMatrix *)((long)&__range1 + 4));
      }
      operator<<((ostream *)
                 &current_system.history_.
                  super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (ExtendedMatrix *)
                 ((long)&current_system.start_system_.extension_column_permutation_.permutation_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + 0x10));
    }
    __gnu_cxx::
    __normal_iterator<const_LinearSystem::Operation_*,_std::vector<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  ~LinearSystem((LinearSystem *)local_2c8);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &current_system.history_.
              super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::string LinearSystem::ToString() const {
  std::ostringstream out;
  LinearSystem current_system(start_system_, mode_);
  out << current_system.system_;
  SwapMatrix swaps;
  for (const auto& operation : history_) {
    current_system.ApplyOperation(operation);

    if (operation.operation_type == OperationType::SwapRows) {
      swaps.SetRowSwap(operation.lhs, operation.rhs);
      if (mode_ == Mode::LU) {
        int m = system_.GetMainMatrix().GetNumColumns();
        swaps.SetExtensionColumnSwap(operation.lhs + m, operation.rhs + m);
      }
    } else if (operation.operation_type == OperationType::SwapColumns) {
      swaps.SetMainColumnSwap(operation.lhs, operation.rhs);
    }

    if (Options::step_by_step_type != Options::StepByStepType::AllSteps &&
        (Options::step_by_step_type != Options::StepByStepType::MainSteps ||
            operation.operation_type != OperationType::MainOutput)) {
      continue;
    }

    out << std::endl;

    if (!swaps.IsEmpty()) {
      out << swaps << std::endl;
      swaps.Clear();
    }

    out << current_system.system_;
  }

  return out.str();
}